

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<signed_char,unsigned_char,unsigned_char>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,char param,uchar params,uchar params_1)

{
  undefined4 in_ECX;
  string *in_RDI;
  undefined4 in_R8D;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  uchar in_stack_ffffffffffffffbe;
  uchar in_stack_ffffffffffffffbf;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  ExceptionFormatValue::CreateFormatValue<signed_char>(in_stack_ffffffffffffff5f);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            CONCAT44(in_ECX,in_R8D),
            (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x703e83);
  ConstructMessageRecursive<unsigned_char,unsigned_char>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,
             in_stack_ffffffffffffffbe);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}